

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::PoolingLayerParams::MergePartialFromCodedStream
          (PoolingLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  unsigned_long uVar9;
  SamePadding *this_00;
  PoolingLayerParams_ValidCompletePadding *this_01;
  ValidPadding *this_02;
  pair<int,_int> pVar10;
  RepeatedField<unsigned_long> *pRVar11;
  char cVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  
LAB_00487d9b:
  pbVar3 = input->buffer_;
  uVar8 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar13 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar8 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
      goto LAB_00488191;
      uVar13 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar13 = uVar13 | 0x100000000;
  }
  else {
LAB_00488191:
    uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar13 = 0;
    if (uVar8 - 1 < 0x3fff) {
      uVar13 = 0x100000000;
    }
    uVar13 = uVar8 | uVar13;
  }
  uVar8 = (uint32)uVar13;
  if ((uVar13 & 0x100000000) != 0) {
    uVar6 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar13;
    if (uVar6 < 0x1f) {
      if (0x13 < uVar6) {
        if (uVar6 != 0x14) {
          if ((uVar6 == 0x1e) && (cVar12 == -0xe)) {
            if (this->_oneof_case_[0] == 0x1e) {
              this_02 = (this->PoolingPaddingType_).valid_;
            }
            else {
              clear_PoolingPaddingType(this);
              this->_oneof_case_[0] = 0x1e;
              this_02 = (ValidPadding *)operator_new(0x20);
              ValidPadding::ValidPadding(this_02);
              (this->PoolingPaddingType_).valid_ = this_02;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = ValidPadding::MergePartialFromCodedStream(this_02,input);
            goto LAB_0048817e;
          }
          goto LAB_00487df8;
        }
        if (cVar12 == -0x60) {
          iVar7 = 2;
          uVar8 = 0xa2;
          pRVar11 = &this->stride_;
LAB_00487fc5:
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (iVar7,uVar8,input,pRVar11);
        }
        else {
          pRVar11 = &this->stride_;
          if ((uVar8 & 0xff) != 0xa2) goto LAB_00487df8;
LAB_00487f69:
          bVar5 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar11);
        }
        goto LAB_00487e18;
      }
      if (uVar6 == 1) {
        if (cVar12 != '\b') goto LAB_00487df8;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar13 = (ulong)bVar2;
          uVar8 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_004881b7;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar8 = 0;
LAB_004881b7:
          uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar13 < 0) {
            return false;
          }
        }
        this->type_ = (int)uVar13;
        goto LAB_00487d9b;
      }
      if (uVar6 == 10) {
        if (cVar12 == 'P') {
          iVar7 = 1;
          uVar8 = 0x52;
          pRVar11 = &this->kernelsize_;
          goto LAB_00487fc5;
        }
        pRVar11 = &this->kernelsize_;
        if ((uVar8 & 0xff) == 0x52) goto LAB_00487f69;
      }
    }
    else {
      if (uVar6 < 0x32) {
        if (uVar6 == 0x1f) {
          if (cVar12 == -6) {
            if (this->_oneof_case_[0] == 0x1f) {
              this_00 = (this->PoolingPaddingType_).same_;
            }
            else {
              clear_PoolingPaddingType(this);
              this->_oneof_case_[0] = 0x1f;
              this_00 = (SamePadding *)operator_new(0x18);
              SamePadding::SamePadding(this_00);
              (this->PoolingPaddingType_).same_ = this_00;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar7);
            if ((long)pVar10 < 0) {
              return false;
            }
            bVar5 = SamePadding::MergePartialFromCodedStream(this_00,input);
LAB_0048817e:
            if (bVar5 == false) {
              return false;
            }
            bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar10.first);
            goto LAB_00487e18;
          }
        }
        else if ((uVar6 == 0x20) && (cVar12 == '\x02')) {
          if (this->_oneof_case_[0] == 0x20) {
            this_01 = (this->PoolingPaddingType_).includelastpixel_;
          }
          else {
            clear_PoolingPaddingType(this);
            this->_oneof_case_[0] = 0x20;
            this_01 = (PoolingLayerParams_ValidCompletePadding *)operator_new(0x28);
            PoolingLayerParams_ValidCompletePadding::PoolingLayerParams_ValidCompletePadding
                      (this_01);
            (this->PoolingPaddingType_).includelastpixel_ = this_01;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = PoolingLayerParams_ValidCompletePadding::MergePartialFromCodedStream
                            (this_01,input);
          goto LAB_0048817e;
        }
        goto LAB_00487df8;
      }
      if (uVar6 == 0x32) {
        if (cVar12 == -0x70) {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar14.first;
            if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->avgpoolexcludepadding_ = uVar9 != 0;
          goto LAB_00487d9b;
        }
      }
      else if ((uVar6 == 0x3c) && (cVar12 == -0x20)) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar9 = pVar14.first;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->globalpooling_ = uVar9 != 0;
        goto LAB_00487d9b;
      }
    }
  }
LAB_00487df8:
  if (uVar8 == 0) {
    return true;
  }
  if ((uVar8 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
LAB_00487e18:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_00487d9b;
}

Assistant:

bool PoolingLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PoolingLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::PoolingLayerParams_PoolingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 kernelSize = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_kernelsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 82u, input, this->mutable_kernelsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 stride = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_stride())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(160u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 162u, input, this->mutable_stride())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ValidPadding valid = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_valid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamePadding same = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_same()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(258u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_includelastpixel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool avgPoolExcludePadding = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &avgpoolexcludepadding_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool globalPooling = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(480u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &globalpooling_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PoolingLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PoolingLayerParams)
  return false;
#undef DO_
}